

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  u8 *puVar1;
  WhereTerm *pWVar2;
  long lVar3;
  
  do {
    if (pTerm == (WhereTerm *)0x0) {
      return;
    }
    if ((pTerm->wtFlags & 4) != 0) {
      return;
    }
    if ((pLevel->iLeftJoin != 0) && ((pTerm->pExpr->flags & 1) == 0)) {
      return;
    }
    pTerm->wtFlags = pTerm->wtFlags | 4;
    lVar3 = (long)pTerm->iParent;
    if (lVar3 < 0) {
      return;
    }
    pWVar2 = pTerm->pWC->a;
    pTerm = pWVar2 + lVar3;
    puVar1 = &pWVar2[lVar3].nChild;
    *puVar1 = *puVar1 + 0xff;
  } while (*puVar1 == '\0');
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  if( pTerm
      && (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_FromJoin))
  ){
    pTerm->wtFlags |= TERM_CODED;
    if( pTerm->iParent>=0 ){
      WhereTerm *pOther = &pTerm->pWC->a[pTerm->iParent];
      if( (--pOther->nChild)==0 ){
        disableTerm(pLevel, pOther);
      }
    }
  }
}